

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O0

void __thiscall
jsoncons::jsonschema::
one_of_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
::do_validate(one_of_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
              *this)

{
  error_reporter *in_stack_00000350;
  evaluation_results *in_stack_00000358;
  json_pointer *in_stack_00000360;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_stack_00000368;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_stack_00000370;
  one_of_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_stack_00000378;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_stack_00000390;
  
  one_of_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::do_validate(in_stack_00000378,in_stack_00000370,in_stack_00000368,in_stack_00000360,
                in_stack_00000358,in_stack_00000350,in_stack_00000390);
  return;
}

Assistant:

walk_result do_validate(const eval_context<Json>& context, const Json& instance, 
            const jsonpointer::json_pointer& instance_location,
            evaluation_results& results, 
            error_reporter& reporter, 
            Json& patch) const final
        {
            //std::cout << "any_of_validator.do_validate " << context.eval_path().string() << ", " << instance << "\n";

            collecting_error_listener local_reporter;

            eval_context<Json> this_context(context, this->keyword_name());

            evaluation_results local_results1;
            std::vector<std::size_t> indices;
            for (std::size_t i = 0; i < validators_.size(); ++i) 
            {
                evaluation_results local_results2;
                eval_context<Json> item_context(this_context, i);

                std::size_t errors = local_reporter.errors.size();
                walk_result result = validators_[i]->validate(item_context, instance, instance_location, local_results2, local_reporter, patch);
                if (result == walk_result::abort)
                {
                    return result;
                }
                if (errors == local_reporter.errors.size())
                {
                    local_results1.merge(local_results2);
                    indices.push_back(i);
                }
                //std::cout << "success: " << i << " " << success << "\n";
            }

            
            if (indices.size() == 1)
            {
                results.merge(local_results1);
            }
            else 
            {
                std::string message;
                if (indices.size() == 0)
                {
                    message = "Must be valid against exactly one schema, but found no matching schemas";
                }
                else
                {
                    message = "Must be valid against exactly one schema, but found " + std::to_string(indices.size()) + " matching schemas at indices ";
                    for (std::size_t i = 0; i < indices.size(); ++i)
                    {
                        if (i > 0)
                        {
                            message.push_back(',');
                        }
                        message.append(std::to_string(i));
                    }
                }
                walk_result result = reporter.error(this->make_validation_message(
                    this_context.eval_path(),
                    instance_location, 
                    message, 
                    local_reporter.errors));
                if (result == walk_result::abort)
                {
                    return result;
                }
            }
            return walk_result::advance;
        }